

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *in_RSI;
  undefined1 *in_RDI;
  ImFontAtlas *this_00;
  ImGuiNextWindowData *in_stack_fffffffffffffe80;
  void *local_178;
  ImPool<ImGuiTable> *in_stack_fffffffffffffe90;
  ImGuiInputTextState *in_stack_fffffffffffffea0;
  ImDrawListSharedData *in_stack_fffffffffffffeb0;
  ImGuiIO *in_stack_fffffffffffffef0;
  ImVec2 local_5c;
  ImVec2 local_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  ImVec2 local_3c;
  undefined1 local_31;
  ImGuiNextWindowData *local_30;
  void *local_28;
  void *local_10;
  
  local_10 = in_RSI;
  ImGuiIO::ImGuiIO(in_stack_fffffffffffffef0);
  ImGuiStyle::ImGuiStyle((ImGuiStyle *)in_stack_fffffffffffffef0);
  ImDrawListSharedData::ImDrawListSharedData(in_stack_fffffffffffffeb0);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a88));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1a98));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1aa8));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1ab8));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x33a3e8);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1b10));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 7000));
  ImGuiNextWindowData::ImGuiNextWindowData(in_stack_fffffffffffffe80);
  ImGuiNextItemData::ImGuiNextItemData((ImGuiNextItemData *)0x33a440);
  ImVector<ImGuiColorMod>::ImVector((ImVector<ImGuiColorMod> *)(in_RDI + 0x1c10));
  ImVector<ImGuiStyleMod>::ImVector((ImVector<ImGuiStyleMod> *)(in_RDI + 0x1c20));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x1c30));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x1c40));
  ImVector<int>::ImVector((ImVector<int> *)(in_RDI + 0x1c50));
  ImVector<ImGuiGroupData>::ImVector((ImVector<ImGuiGroupData> *)(in_RDI + 0x1c60));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x1c70));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x1c80));
  ImVector<ImGuiViewportP_*>::ImVector((ImVector<ImGuiViewportP_*> *)(in_RDI + 0x1c90));
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe80);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe80);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffe80);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffe80);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffe80);
  ImGuiPayload::ImGuiPayload((ImGuiPayload *)0x33a5d2);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe80);
  ImVector<unsigned_char>::ImVector((ImVector<unsigned_char> *)(in_RDI + 0x1ea8));
  ImPool<ImGuiTable>::ImPool(in_stack_fffffffffffffe90);
  ImVector<ImGuiPtrOrIndex>::ImVector((ImVector<ImGuiPtrOrIndex> *)(in_RDI + 0x1ef8));
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x1f08));
  ImVector<ImDrawChannel>::ImVector((ImVector<ImDrawChannel> *)(in_RDI + 0x1f18));
  ImPool<ImGuiTabBar>::ImPool((ImPool<ImGuiTabBar> *)in_stack_fffffffffffffe90);
  ImVector<ImGuiPtrOrIndex>::ImVector((ImVector<ImGuiPtrOrIndex> *)(in_RDI + 0x1f58));
  ImVector<ImGuiShrinkWidthItem>::ImVector((ImVector<ImGuiShrinkWidthItem> *)(in_RDI + 0x1f68));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1f78));
  ImGuiInputTextState::ImGuiInputTextState(in_stack_fffffffffffffea0);
  ImFont::ImFont((ImFont *)in_stack_fffffffffffffea0);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x2ea4));
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x2ed0));
  this_00 = (ImFontAtlas *)(in_RDI + 12000);
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)this_00);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2ef0));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2ef8));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x33a7ae);
  ImVector<ImGuiSettingsHandler>::ImVector((ImVector<ImGuiSettingsHandler> *)(in_RDI + 0x2f18));
  ImChunkStream<ImGuiWindowSettings>::ImChunkStream((ImChunkStream<ImGuiWindowSettings> *)0x33a7e4);
  ImChunkStream<ImGuiTableSettings>::ImChunkStream((ImChunkStream<ImGuiTableSettings> *)0x33a7ff);
  ImVector<ImGuiContextHook>::ImVector((ImVector<ImGuiContextHook> *)(in_RDI + 0x2f48));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x33a835);
  ImGuiMetricsConfig::ImGuiMetricsConfig((ImGuiMetricsConfig *)(in_RDI + 0x2fac));
  *in_RDI = 0;
  in_RDI[1] = -(local_10 == (void *)0x0) & 1;
  *(undefined8 *)(in_RDI + 0x1978) = 0;
  *(undefined4 *)(in_RDI + 0x1984) = 0;
  *(undefined4 *)(in_RDI + 0x1980) = 0;
  local_31 = 0;
  if (local_10 == (void *)0x0) {
    in_stack_fffffffffffffe80 =
         (ImGuiNextWindowData *)ImGui::MemAlloc((size_t)in_stack_fffffffffffffe80);
    local_178 = operator_new(0x488);
    local_31 = 1;
    local_30 = in_stack_fffffffffffffe80;
    local_28 = local_178;
    ImFontAtlas::ImFontAtlas(this_00);
  }
  else {
    local_178 = local_10;
  }
  *(void **)(in_RDI + 0xa8) = local_178;
  *(undefined8 *)(in_RDI + 0x1a60) = 0;
  *(undefined4 *)(in_RDI + 0x1a68) = 0;
  *(undefined4 *)(in_RDI + 0x1a70) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1a6c) = 0xffffffff;
  in_RDI[0x1a76] = 0;
  in_RDI[0x1a75] = 0;
  in_RDI[0x1a74] = 0;
  in_RDI[0x1a77] = 0;
  in_RDI[0x1a78] = 0;
  *(undefined4 *)(in_RDI + 0x1a7c) = 0;
  *(undefined8 *)(in_RDI + 0x1a80) = 0;
  *(undefined4 *)(in_RDI + 0x1ad8) = 0;
  *(undefined8 *)(in_RDI + 0x1ae0) = 0;
  *(undefined8 *)(in_RDI + 0x1ae8) = 0;
  *(undefined8 *)(in_RDI + 0x1af0) = 0;
  *(undefined8 *)(in_RDI + 0x1af8) = 0;
  *(undefined8 *)(in_RDI + 0x1b00) = 0;
  *(undefined8 *)(in_RDI + 0x1b08) = 0;
  *(undefined4 *)(in_RDI + 0x1b18) = 0;
  *(undefined4 *)(in_RDI + 0x1b20) = 0;
  *(undefined4 *)(in_RDI + 0x1b1c) = 0;
  in_RDI[0x1b24] = 0;
  in_RDI[0x1b26] = 0;
  in_RDI[0x1b25] = 0;
  in_RDI[0x1b27] = 0;
  *(undefined4 *)(in_RDI + 0x1b2c) = 0;
  *(undefined4 *)(in_RDI + 0x1b28) = 0;
  *(undefined4 *)(in_RDI + 0x1b30) = 0;
  *(undefined4 *)(in_RDI + 0x1b34) = 0;
  *(undefined4 *)(in_RDI + 0x1b38) = 0;
  in_RDI[0x1b3c] = 0;
  in_RDI[0x1b3d] = 0;
  in_RDI[0x1b3e] = 0;
  in_RDI[0x1b3f] = 0;
  in_RDI[0x1b40] = 0;
  in_RDI[0x1b41] = 0;
  in_RDI[0x1b42] = 0;
  *(undefined4 *)(in_RDI + 0x1b44) = 0;
  *(undefined4 *)(in_RDI + 0x1b48) = 0;
  *(undefined8 *)(in_RDI + 0x1b50) = 0;
  ImVec2::ImVec2(&local_3c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 7000) = local_3c;
  *(undefined8 *)(in_RDI + 0x1b60) = 0;
  *(undefined4 *)(in_RDI + 0x1b68) = 0;
  *(undefined4 *)(in_RDI + 0x1b6c) = 0;
  *(undefined4 *)(in_RDI + 0x1b70) = 0;
  in_RDI[0x1b74] = 0;
  in_RDI[0x1b75] = 0;
  *(undefined8 *)(in_RDI + 0x1b78) = 0;
  *(undefined4 *)(in_RDI + 0x1b80) = 0;
  *(undefined4 *)(in_RDI + 0x1b84) = 0;
  *(undefined8 *)(in_RDI + 0x1ca0) = 0;
  *(undefined4 *)(in_RDI + 0x1cbc) = 0;
  *(undefined4 *)(in_RDI + 0x1cb8) = 0;
  *(undefined4 *)(in_RDI + 0x1cb4) = 0;
  *(undefined4 *)(in_RDI + 0x1cb0) = 0;
  *(undefined4 *)(in_RDI + 0x1cac) = 0;
  *(undefined4 *)(in_RDI + 0x1ca8) = 0;
  *(undefined4 *)(in_RDI + 0x1cd0) = 0;
  *(undefined4 *)(in_RDI + 0x1cc8) = 0;
  *(undefined4 *)(in_RDI + 0x1cc4) = 0;
  *(undefined4 *)(in_RDI + 0x1cc0) = 0;
  *(undefined4 *)(in_RDI + 0x1ccc) = 0;
  *(undefined4 *)(in_RDI + 0x1cd4) = 0;
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe80);
  *(undefined8 *)(in_RDI + 0x1cd8) = local_4c;
  *(undefined8 *)(in_RDI + 0x1ce0) = uStack_44;
  *(undefined4 *)(in_RDI + 0x1ce8) = 0;
  *(undefined4 *)(in_RDI + 0x1cec) = 0;
  *(undefined4 *)(in_RDI + 0x1cf0) = 0x7fffffff;
  in_RDI[0x1cf4] = 0;
  in_RDI[0x1cf5] = 0;
  in_RDI[0x1cf6] = 1;
  in_RDI[0x1cf7] = 0;
  in_RDI[0x1cf8] = 0;
  in_RDI[0x1cf9] = 0;
  in_RDI[0x1cfa] = 0;
  *(undefined4 *)(in_RDI + 0x1cfc) = 0;
  in_RDI[0x1d10] = 0;
  *(undefined4 *)(in_RDI + 0x1d14) = 0;
  *(undefined4 *)(in_RDI + 0x1d18) = 0;
  *(undefined4 *)(in_RDI + 0x1d1c) = 0;
  *(undefined4 *)(in_RDI + 0x1d28) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1d24) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1d20) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x1dc0) = 0;
  *(undefined4 *)(in_RDI + 0x1dc8) = 0;
  *(undefined8 *)(in_RDI + 0x1de0) = 0;
  *(undefined8 *)(in_RDI + 0x1dd8) = 0;
  *(undefined8 *)(in_RDI + 0x1dd0) = 0;
  *(undefined4 *)(in_RDI + 0x1dec) = 0;
  *(undefined4 *)(in_RDI + 0x1de8) = 0;
  in_RDI[0x1df0] = 0;
  *(undefined8 *)(in_RDI + 0x1e00) = 0;
  *(undefined8 *)(in_RDI + 0x1df8) = 0;
  *(undefined4 *)(in_RDI + 0x1e0c) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1e08) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1e14) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1e10) = 0x7fffffff;
  in_RDI[0x1e18] = 0;
  *(undefined4 *)(in_RDI + 0x1e1c) = 0;
  *(undefined4 *)(in_RDI + 0x1e20) = 0;
  in_RDI[0x1e26] = 0;
  in_RDI[0x1e25] = 0;
  in_RDI[0x1e24] = 0;
  *(undefined4 *)(in_RDI + 0x1e28) = 0;
  *(undefined4 *)(in_RDI + 0x1e2c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1e30) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1e88) = 0;
  *(undefined4 *)(in_RDI + 0x1e8c) = 0;
  *(undefined4 *)(in_RDI + 0x1e90) = 0;
  *(undefined4 *)(in_RDI + 0x1e94) = 0;
  *(undefined4 *)(in_RDI + 0x1e98) = 0;
  *(undefined4 *)(in_RDI + 0x1e9c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1ea0) = 0;
  *(undefined8 *)(in_RDI + 0x1eb8) = 0;
  *(undefined8 *)(in_RDI + 0x1ec0) = 0;
  *(undefined8 *)(in_RDI + 0x1ec8) = 0;
  *(undefined8 *)(in_RDI + 0x1f28) = 0;
  ImVec2::ImVec2(&local_54,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x1f78) = local_54;
  *(undefined4 *)(in_RDI + 0x2e88) = 0;
  *(undefined4 *)(in_RDI + 0x2e8c) = 0xa900000;
  *(undefined4 *)(in_RDI + 0x2e94) = 0;
  *(undefined4 *)(in_RDI + 0x2e90) = 0;
  *(undefined4 *)(in_RDI + 0x2ea0) = 0x7f7fffff;
  *(undefined4 *)(in_RDI + 0x2e9c) = 0x7f7fffff;
  *(undefined4 *)(in_RDI + 0x2e98) = 0x7f7fffff;
  *(undefined4 *)(in_RDI + 0x2eb4) = 0;
  in_RDI[0x2eb8] = 0;
  in_RDI[0x2eb9] = 0;
  *(undefined4 *)(in_RDI + 0x2ebc) = 0;
  *(undefined4 *)(in_RDI + 0x2ec0) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x2ec4) = 0;
  *(undefined4 *)(in_RDI + 0x2ec8) = 0;
  *(undefined4 *)(in_RDI + 0x2ecc) = 0x3f000000;
  ImVec2::ImVec2(&local_5c,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x2ef8) = local_5c;
  *(undefined8 *)(in_RDI + 0x2ef0) = *(undefined8 *)(in_RDI + 0x2ef8);
  in_RDI[0x2f00] = 0x2e;
  in_RDI[0x2f01] = 0;
  *(undefined4 *)(in_RDI + 0x2f04) = 0;
  *(undefined4 *)(in_RDI + 0x2f58) = 0;
  in_RDI[0x2f5c] = 0;
  *(undefined4 *)(in_RDI + 0x2f60) = 0;
  *(undefined8 *)(in_RDI + 0x2f88) = 0;
  *(undefined8 *)(in_RDI + 0x2f80) = 0;
  *(undefined8 *)(in_RDI + 0x2f68) = 0;
  *(undefined4 *)(in_RDI + 0x2f90) = 0x7f7fffff;
  in_RDI[0x2f94] = 0;
  *(undefined4 *)(in_RDI + 0x2f98) = 0;
  *(undefined4 *)(in_RDI + 0x2fa0) = 2;
  *(undefined4 *)(in_RDI + 0x2f9c) = 2;
  in_RDI[0x2fa4] = 0;
  *(undefined4 *)(in_RDI + 0x2fa8) = 0;
  memset(in_RDI + 0x2fbc,0,0x1e0);
  *(undefined4 *)(in_RDI + 0x319c) = 0;
  *(undefined4 *)(in_RDI + 0x31a0) = 0;
  *(undefined4 *)(in_RDI + 0x31ac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x31a8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x31a4) = 0xffffffff;
  memset(in_RDI + 0x31b0,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngineHookIdInfo = 0;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowTimer = 0.0f;

        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdUsingMouseWheel = HoveredIdPreviousFrameUsingMouseWheel = false;
        HoveredIdDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdUsingMouseWheel = false;
        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingNavInputMask = 0x00;
        ActiveIdUsingKeyInputMask = 0x00;
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavJustMovedToKeyMods = ImGuiKeyModFlags_None;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRect = ImRect();
        NavScoringCount = 0;
        NavLayer = ImGuiNavLayer_Main;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveRequest = false;
        NavMoveRequestFlags = ImGuiNavMoveFlags_None;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveRequestKeyMods = ImGuiKeyModFlags_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;
        NavWrapRequestWindow = NULL;
        NavWrapRequestFlags = ImGuiNavMoveFlags_None;

        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        FocusRequestCurrWindow = FocusRequestNextWindow = NULL;
        FocusRequestCurrCounterRegular = FocusRequestCurrCounterTabStop = INT_MAX;
        FocusRequestNextCounterRegular = FocusRequestNextCounterTabStop = INT_MAX;
        FocusTabPressed = false;

        DimBgRatio = 0.0f;
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        CurrentTable = NULL;
        CurrentTabBar = NULL;

        LastValidMousePos = ImVec2(0.0f, 0.0f);
        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor[0] = ColorEditLastColor[1] = ColorEditLastColor[2] = FLT_MAX;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        TooltipOverrideCount = 0;
        TooltipSlowDelay = 0.50f;

        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);
        PlatformLocaleDecimalPoint = '.';

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;
        HookIdNext = 0;

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogNextPrefix = LogNextSuffix = NULL;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugItemPickerActive = false;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }